

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O1

SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream,size_t UTimestep)

{
  undefined8 *puVar1;
  long lVar2;
  SstMetaMetaList p_Var3;
  long lVar4;
  size_t *psVar5;
  long lVar6;
  
  pthread_mutex_lock((pthread_mutex_t *)&Stream->DataLock);
  if (Stream->InternalMetaMetaCount < 1) {
    p_Var3 = (SstMetaMetaList)0x0;
  }
  else {
    lVar6 = (ulong)(uint)Stream->InternalMetaMetaCount * 0x20;
    p_Var3 = (SstMetaMetaList)malloc(lVar6 + 0x20);
    psVar5 = &Stream->InternalMetaMetaInfo->IDSize;
    lVar2 = 0;
    do {
      lVar4 = lVar2;
      *(char **)((long)&p_Var3->BlockData + lVar4) = (char *)psVar5[-3];
      *(size_t *)((long)&p_Var3->BlockSize + lVar4) = psVar5[-2];
      *(char **)((long)&p_Var3->ID + lVar4) = (char *)psVar5[-1];
      *(size_t *)((long)&p_Var3->IDSize + lVar4) = *psVar5;
      psVar5 = psVar5 + 5;
      lVar2 = lVar4 + 0x20;
    } while (lVar6 != lVar4 + 0x20);
    puVar1 = (undefined8 *)((long)&p_Var3[1].ID + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&p_Var3[1].BlockData + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Stream->DataLock);
  return p_Var3;
}

Assistant:

extern SstMetaMetaList SstGetNewMetaMetaData(SstStream Stream, size_t UTimestep)
{
    ssize_t Timestep = (ssize_t)UTimestep;
    int RetCount = 0;
    STREAM_MUTEX_LOCK(Stream);
    ssize_t LastRetTimestep = -1;
    int i;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
            RetCount++;
    }
    if (RetCount == 0)
    {
        STREAM_MUTEX_UNLOCK(Stream);
        return NULL;
    }
    SstMetaMetaList ret = malloc(sizeof(ret[0]) * (RetCount + 1));
    int j = 0;
    for (i = 0; i < Stream->InternalMetaMetaCount; i++)
    {
        if ((LastRetTimestep == -1) ||
            (Stream->InternalMetaMetaInfo[i].TimestepAdded >= LastRetTimestep))
        {
            // no copies, keep memory ownership in SST
            ret[j].BlockData = Stream->InternalMetaMetaInfo[i].BlockData;
            ret[j].BlockSize = Stream->InternalMetaMetaInfo[i].BlockSize;
            ret[j].ID = Stream->InternalMetaMetaInfo[i].ID;
            ret[j].IDSize = Stream->InternalMetaMetaInfo[i].IDSize;
            j++;
        }
    }
    memset(&ret[j], 0, sizeof(ret[j]));
    LastRetTimestep = Timestep;
    STREAM_MUTEX_UNLOCK(Stream);
    return ret;
}